

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_utils.c
# Opt level: O2

void gotcha_init(void)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *__nptr;
  
  if (gotcha_init_gotcha_initialized != '\0') {
    return;
  }
  gotcha_init_gotcha_initialized = 1;
  if (debug_init_debug_initialized == '\0') {
    debug_init_debug_initialized = '\x01';
    __nptr = getenv("GOTCHA_DEBUG");
    if (__nptr != (char *)0x0) {
      iVar1 = atoi(__nptr);
      __stream = _stderr;
      debug_level = 1;
      if (1 < iVar1) {
        debug_level = iVar1;
      }
      uVar2 = gotcha_gettid();
      uVar3 = getpid();
      fprintf(__stream,"[%d/%d][%s:%u] - Gotcha debug initialized at level %d\n",(ulong)uVar2,
              (ulong)uVar3,"gotcha_utils.c",0x2d,debug_level);
    }
  }
  create_hashtable(&library_table,0x80,link_map_hash,link_map_cmp);
  create_hashtable(&function_hash_table,0x1000,strhash,strcmp);
  create_hashtable(&notfound_binding_table,0x80,strhash,strcmp);
  handle_libdl();
  return;
}

Assistant:

void gotcha_init() {
  static int gotcha_initialized = 0;
  if (gotcha_initialized) {
    return;
  }
  gotcha_initialized = 1;
  debug_init();
  setup_hash_tables();
  handle_libdl();
}